

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_exp.c
# Opt level: O0

unsigned_long bn_get_bits(BIGNUM *a,int bitpos)

{
  int iVar1;
  byte bVar2;
  int wordpos;
  unsigned_long ret;
  int bitpos_local;
  BIGNUM *a_local;
  
  ret = 0;
  iVar1 = bitpos / 0x40;
  if (((-1 < iVar1) && (iVar1 < a->top)) && (ret = a->d[iVar1], bitpos % 0x40 != 0)) {
    bVar2 = (byte)(bitpos % 0x40);
    ret = ret >> (bVar2 & 0x3f);
    if (iVar1 + 1 < a->top) {
      ret = a->d[iVar1 + 1] << (0x40 - bVar2 & 0x3f) | ret;
    }
  }
  return ret;
}

Assistant:

static BN_ULONG bn_get_bits(const BIGNUM *a, int bitpos)
{
    BN_ULONG ret = 0;
    int wordpos;

    wordpos = bitpos / BN_BITS2;
    bitpos %= BN_BITS2;
    if (wordpos >= 0 && wordpos < a->top) {
        ret = a->d[wordpos] & BN_MASK2;
        if (bitpos) {
            ret >>= bitpos;
            if (++wordpos < a->top)
                ret |= a->d[wordpos] << (BN_BITS2 - bitpos);
        }
    }

    return ret & BN_MASK2;
}